

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

void __thiscall
booster::locale::basic_message<char>::basic_message
          (basic_message<char> *this,basic_message<char> *other)

{
  char_type *pcVar1;
  
  this->n_ = other->n_;
  pcVar1 = other->c_context_;
  this->c_id_ = other->c_id_;
  this->c_context_ = pcVar1;
  this->c_plural_ = other->c_plural_;
  std::__cxx11::string::string((string *)&this->id_,(string *)&other->id_);
  std::__cxx11::string::string((string *)&this->context_,(string *)&other->context_);
  std::__cxx11::string::string((string *)&this->plural_,(string *)&other->plural_);
  return;
}

Assistant:

basic_message(basic_message const &other) :
                n_(other.n_),
                c_id_(other.c_id_),
                c_context_(other.c_context_),
                c_plural_(other.c_plural_),
                id_(other.id_),
                context_(other.context_),
                plural_(other.plural_)
            {
            }